

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O2

void __thiscall libchars::edit_object::wipe(edit_object *this)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar1 = this->buflen;
  uVar3 = this->insert_idx;
  if (uVar3 < uVar1) {
    pcVar2 = this->buffer + (uVar1 - 1);
    while (uVar3 < uVar1) {
      *pcVar2 = '\0';
      uVar3 = this->insert_idx;
      uVar1 = this->buflen - 1;
      this->buflen = uVar1;
      pcVar2 = pcVar2 + -1;
    }
    if (uVar1 == 0) {
      (*this->_vptr_edit_object[2])();
      return;
    }
  }
  return;
}

Assistant:

virtual void wipe()
        {
            if (buflen > insert_idx) {
                volatile char *p = buffer + buflen - 1;
                while (buflen > insert_idx) {
                    *p-- = 0;
                    --buflen;
                }
                if (buflen == 0)
                    emptied();
            }
        }